

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

void telnet_send_zmp(telnet_t *telnet,size_t argc,char **argv)

{
  size_t sVar1;
  
  telnet_begin_zmp(telnet,*argv);
  for (sVar1 = 1; argc != sVar1; sVar1 = sVar1 + 1) {
    telnet_zmp_arg(telnet,argv[sVar1]);
  }
  telnet_iac(telnet,0xf0);
  return;
}

Assistant:

void telnet_send_zmp(telnet_t *telnet, size_t argc, const char **argv) {
	size_t i;

	/* ZMP header */
	telnet_begin_zmp(telnet, argv[0]);

	/* send out each argument, including trailing NUL byte */
	for (i = 1; i != argc; ++i)
		telnet_zmp_arg(telnet, argv[i]);

	/* ZMP footer */
	telnet_finish_zmp(telnet);
}